

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O2

OPJ_OFF_T opj_stream_read_skip
                    (opj_stream_private_t *p_stream,OPJ_OFF_T p_size,opj_event_mgr_t *p_event_mgr)

{
  OPJ_UINT64 p_size_00;
  OPJ_OFF_T OVar1;
  opj_event_mgr_t *p_event_mgr_00;
  ulong uVar2;
  long lVar3;
  
  if (p_size < 0) {
    __assert_fail("p_size >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/cio.c"
                  ,0x1d5,
                  "OPJ_OFF_T opj_stream_read_skip(opj_stream_private_t *, OPJ_OFF_T, opj_event_mgr_t *)"
                 );
  }
  uVar2 = p_stream->m_bytes_in_buffer;
  if (uVar2 < (ulong)p_size) {
    if ((p_stream->m_status & 4) == 0) {
      if (uVar2 != 0) {
        p_stream->m_current_data = p_stream->m_stored_data;
        p_size = p_size - uVar2;
        p_stream->m_bytes_in_buffer = 0;
      }
      for (; 0 < p_size; p_size = p_size - OVar1) {
        if (p_stream->m_user_data_length < p_stream->m_byte_offset + uVar2 + p_size) {
          opj_event_msg(p_event_mgr,4,"Stream reached its end !\n");
          lVar3 = uVar2 + p_stream->m_byte_offset;
          p_stream->m_byte_offset = lVar3;
          p_size_00 = p_stream->m_user_data_length;
          opj_stream_read_seek(p_stream,p_size_00,p_event_mgr_00);
          *(byte *)&p_stream->m_status = (byte)p_stream->m_status | 4;
          lVar3 = p_size_00 - lVar3;
          if (lVar3 == 0) {
            return -1;
          }
          return lVar3;
        }
        OVar1 = (*p_stream->m_skip_fn)(p_size,p_stream->m_user_data);
        if (OVar1 == -1) {
          opj_event_msg(p_event_mgr,4,"Stream reached its end !\n");
          *(byte *)&p_stream->m_status = (byte)p_stream->m_status | 4;
          p_stream->m_byte_offset = p_stream->m_byte_offset + uVar2;
          goto LAB_00108b6a;
        }
        uVar2 = uVar2 + OVar1;
      }
      p_stream->m_byte_offset = p_stream->m_byte_offset + uVar2;
      p_size = uVar2;
    }
    else {
      p_stream->m_current_data = p_stream->m_current_data + uVar2;
      p_stream->m_bytes_in_buffer = 0;
      p_stream->m_byte_offset = p_stream->m_byte_offset + uVar2;
LAB_00108b6a:
      p_size = -(ulong)(uVar2 == 0) | uVar2;
    }
  }
  else {
    p_stream->m_current_data = p_stream->m_current_data + p_size;
    p_stream->m_bytes_in_buffer = uVar2 - p_size;
    p_stream->m_byte_offset = p_stream->m_byte_offset + p_size;
  }
  return p_size;
}

Assistant:

OPJ_OFF_T opj_stream_read_skip(opj_stream_private_t * p_stream,
                               OPJ_OFF_T p_size, opj_event_mgr_t * p_event_mgr)
{
    OPJ_OFF_T l_skip_nb_bytes = 0;
    OPJ_OFF_T l_current_skip_nb_bytes = 0;

    assert(p_size >= 0);

    if (p_stream->m_bytes_in_buffer >= (OPJ_SIZE_T)p_size) {
        p_stream->m_current_data += p_size;
        /* it is safe to cast p_size to OPJ_SIZE_T since it is <= m_bytes_in_buffer
        which is of type OPJ_SIZE_T */
        p_stream->m_bytes_in_buffer -= (OPJ_SIZE_T)p_size;
        l_skip_nb_bytes += p_size;
        p_stream->m_byte_offset += l_skip_nb_bytes;
        return l_skip_nb_bytes;
    }

    /* we are now in the case when the remaining data if not sufficient */
    if (p_stream->m_status & OPJ_STREAM_STATUS_END) {
        l_skip_nb_bytes += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
        p_stream->m_current_data += p_stream->m_bytes_in_buffer;
        p_stream->m_bytes_in_buffer = 0;
        p_stream->m_byte_offset += l_skip_nb_bytes;
        return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T) - 1;
    }

    /* the flag is not set, we copy data and then do an actual skip on the stream */
    if (p_stream->m_bytes_in_buffer) {
        l_skip_nb_bytes += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
        p_stream->m_current_data = p_stream->m_stored_data;
        p_size -= (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
        p_stream->m_bytes_in_buffer = 0;
    }

    while (p_size > 0) {
        /* Check if we are going beyond the end of file. Most skip_fn do not */
        /* check that, but we must be careful not to advance m_byte_offset */
        /* beyond m_user_data_length, otherwise */
        /* opj_stream_get_number_byte_left() will assert. */
        if ((OPJ_UINT64)(p_stream->m_byte_offset + l_skip_nb_bytes + p_size) >
                p_stream->m_user_data_length) {
            opj_event_msg(p_event_mgr, EVT_INFO, "Stream reached its end !\n");

            p_stream->m_byte_offset += l_skip_nb_bytes;
            l_skip_nb_bytes = (OPJ_OFF_T)(p_stream->m_user_data_length -
                                          (OPJ_UINT64)p_stream->m_byte_offset);

            opj_stream_read_seek(p_stream, (OPJ_OFF_T)p_stream->m_user_data_length,
                                 p_event_mgr);
            p_stream->m_status |= OPJ_STREAM_STATUS_END;

            /* end if stream */
            return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T) - 1;
        }

        /* we should do an actual skip on the media */
        l_current_skip_nb_bytes = p_stream->m_skip_fn(p_size, p_stream->m_user_data);
        if (l_current_skip_nb_bytes == (OPJ_OFF_T) - 1) {
            opj_event_msg(p_event_mgr, EVT_INFO, "Stream reached its end !\n");

            p_stream->m_status |= OPJ_STREAM_STATUS_END;
            p_stream->m_byte_offset += l_skip_nb_bytes;
            /* end if stream */
            return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T) - 1;
        }
        p_size -= l_current_skip_nb_bytes;
        l_skip_nb_bytes += l_current_skip_nb_bytes;
    }

    p_stream->m_byte_offset += l_skip_nb_bytes;

    return l_skip_nb_bytes;
}